

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O0

void EntityRelationTask::entity_first_decoding
               (search *sch,multi_ex *ec,v_array<unsigned_long> *predictions,bool isLdf)

{
  ulong uVar1;
  size_type sVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  v_array<unsigned_long> *in_RDX;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  __type_conflict _Var5;
  size_t i;
  size_t n_ent;
  undefined1 in_stack_0000034b;
  ptag in_stack_0000034c;
  v_array<unsigned_long> *in_stack_00000350;
  example *in_stack_00000358;
  search *in_stack_00000360;
  undefined1 in_stack_0000042b;
  ptag in_stack_0000042c;
  v_array<unsigned_long> *in_stack_00000430;
  example *in_stack_00000438;
  search *in_stack_00000440;
  undefined8 local_30;
  
  std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
  _Var5 = std::sqrt<unsigned_long>(0x3ca982);
  uVar1 = (ulong)(_Var5 + -1.0);
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
    if (sVar2 <= local_30) break;
    if (local_30 <
        (uVar1 | (long)((_Var5 + -1.0) - 9.223372036854776e+18) & (long)uVar1 >> 0x3f) >> 1) {
      std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,local_30);
      sVar3 = predict_entity(in_stack_00000360,in_stack_00000358,in_stack_00000350,in_stack_0000034c
                             ,(bool)in_stack_0000034b);
      puVar4 = v_array<unsigned_long>::operator[](in_RDX,local_30);
      *puVar4 = sVar3;
    }
    else {
      std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,local_30);
      sVar3 = predict_relation(in_stack_00000440,in_stack_00000438,in_stack_00000430,
                               in_stack_0000042c,(bool)in_stack_0000042b);
      puVar4 = v_array<unsigned_long>::operator[](in_RDX,local_30);
      *puVar4 = sVar3;
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void entity_first_decoding(Search::search& sch, multi_ex& ec, v_array<size_t>& predictions, bool isLdf = false)
{
  // ec.size = #entity + #entity*(#entity-1)/2
  size_t n_ent = (size_t)(sqrt(ec.size() * 8 + 1) - 1) / 2;
  // Do entity recognition first
  for (size_t i = 0; i < ec.size(); i++)
  {
    if (i < n_ent)
      predictions[i] = predict_entity(sch, ec[i], predictions, (ptag)i, isLdf);
    else
      predictions[i] = predict_relation(sch, ec[i], predictions, (ptag)i, isLdf);
  }
}